

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_ping(ENetPeer *peer)

{
  long in_RDI;
  ENetProtocol command;
  enet_uint16 in_stack_ffffffffffffffc2;
  undefined2 in_stack_ffffffffffffffc4;
  ENetPacket *in_stack_ffffffffffffffc8;
  ENetProtocol *in_stack_ffffffffffffffd0;
  ENetPeer *in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x38) == 5) {
    enet_peer_queue_outgoing_command
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               CONCAT13(0xff,CONCAT12(0x85,in_stack_ffffffffffffffc4)),in_stack_ffffffffffffffc2);
  }
  return;
}

Assistant:

void
enet_peer_ping (ENetPeer * peer)
{
    ENetProtocol command;

    if (peer -> state != ENET_PEER_STATE_CONNECTED)
      return;

    command.header.command = ENET_PROTOCOL_COMMAND_PING | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    command.header.channelID = 0xFF;
   
    enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
}